

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseData.cpp
# Opt level: O3

bool __thiscall
SGParser::Generator::StdGrammarParseData::BuildParser
          (StdGrammarParseData *this,InputStream *pinitStr)

{
  Grammar *this_00;
  bool bVar1;
  StdGrammarParseData *this_01;
  undefined1 local_7c8 [8];
  Lex sgLex;
  Parse<SGParser::Generator::StdGrammarStackElement> sgParser;
  Grammar sgGrammar;
  StdGrammarParseHandler sgParseHandler;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  grammarSymbolVC;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  grammarSymbols;
  vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
  productions;
  DFATokenizer<SGParser::Generator::StdGrammarToken> sgTokenizer;
  vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
  productionVC;
  undefined1 auStack_48 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> startSymbols;
  
  sgLex.Macros._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&sgLex;
  sgLex.Macros._M_t._M_impl._0_4_ = 0;
  sgLex.Macros._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sgLex.Macros._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  sgLex.ExpressionNames._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&sgLex.ExpressionNames;
  sgLex.ExpressionNames._M_t._M_impl._0_4_ = 0;
  sgLex.ExpressionNames._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sgLex.ExpressionNames._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  sgLex.Macros._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  sgLex.Macros._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sgLex.MacroNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sgLex.MacroNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sgLex.MacroNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sgLex.Lexemes.super__Vector_base<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sgLex.Lexemes.super__Vector_base<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sgLex.Lexemes.super__Vector_base<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sgLex.Expressions.
  super__Vector_base<SGParser::Generator::Lex::Expression,_std::allocator<SGParser::Generator::Lex::Expression>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sgLex.Expressions.
  super__Vector_base<SGParser::Generator::Lex::Expression,_std::allocator<SGParser::Generator::Lex::Expression>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sgLex.LexemeNameToToken._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&sgLex.LexemeNameToToken;
  sgLex.LexemeNameToToken._M_t._M_impl._0_4_ = 0;
  sgLex.LexemeNameToToken._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sgLex.LexemeNameToToken._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  sgLex.ExpressionNames._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  sgLex.ExpressionNames._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sgLex.TokenLexemes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sgLex.TokenLexemes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sgLex.LexemeNameToToken._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  sgLex.LexemeAliasToToken._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&sgLex.LexemeAliasToToken;
  sgLex.LexemeAliasToToken._M_t._M_impl._0_4_ = 0;
  sgLex.LexemeAliasToToken._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sgLex.LexemeAliasToToken._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  sgLex.LexemeAliasToToken._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  sgLex.Precedence._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&sgLex.Precedence;
  sgLex.Precedence._M_t._M_impl._0_4_ = 0;
  sgLex.Precedence._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sgLex.Precedence._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  sgLex.NFAParseTable.super_ParseTable.StateInfos.
  super__Vector_base<SGParser::ParseTable::StateInfo,_std::allocator<SGParser::ParseTable::StateInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&sgLex.NFAParseTable.super_ParseTable.ProductionErrorTerminals._M_h._M_rehash_policy
                 ._M_next_resize;
  sgLex.NFAParseTable.super_ParseTable.StateInfos.
  super__Vector_base<SGParser::ParseTable::StateInfo,_std::allocator<SGParser::ParseTable::StateInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sgLex.NFAParseTable.super_ParseTable.StateInfos.
  super__Vector_base<SGParser::ParseTable::StateInfo,_std::allocator<SGParser::ParseTable::StateInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sgLex.NFAParseTable.super_ParseTable.Terminals.
  super__Vector_base<SGParser::ParseTable::Terminal,_std::allocator<SGParser::ParseTable::Terminal>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sgLex.NFAParseTable.super_ParseTable.Terminals.
  super__Vector_base<SGParser::ParseTable::Terminal,_std::allocator<SGParser::ParseTable::Terminal>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sgLex.NFAParseTable.super_ParseTable.NonTerminals.
  super__Vector_base<SGParser::ParseTable::NonTerminal,_std::allocator<SGParser::ParseTable::NonTerminal>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sgLex.NFAParseTable.super_ParseTable.Terminals.
  super__Vector_base<SGParser::ParseTable::Terminal,_std::allocator<SGParser::ParseTable::Terminal>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sgLex.NFAParseTable.super_ParseTable.NonTerminals.
  super__Vector_base<SGParser::ParseTable::NonTerminal,_std::allocator<SGParser::ParseTable::NonTerminal>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sgLex.NFAParseTable.super_ParseTable.NonTerminals.
  super__Vector_base<SGParser::ParseTable::NonTerminal,_std::allocator<SGParser::ParseTable::NonTerminal>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sgLex.Precedence._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  sgLex.Precedence._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sgLex.NFAParseTable.super_ParseTable.ProductionErrorTerminals._M_h._M_buckets = (__buckets_ptr)0x1
  ;
  sgLex.NFAParseTable.super_ParseTable.ProductionErrorTerminals._M_h._M_bucket_count = 0;
  sgLex.NFAParseTable.super_ParseTable.ProductionErrorTerminals._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  sgLex.NFAParseTable.super_ParseTable.ProductionErrorTerminals._M_h._M_element_count._0_4_ =
       0x3f800000;
  sgLex.NFAParseTable.super_ParseTable.ProductionErrorTerminals._M_h._M_rehash_policy.
  _M_max_load_factor = 0.0;
  sgLex.NFAParseTable.super_ParseTable.ProductionErrorTerminals._M_h._M_rehash_policy._4_4_ = 0;
  sgLex.NFAParseTable.super_ParseTable.ProductionErrorTerminals._M_h._M_rehash_policy._M_next_resize
       = 0;
  sgLex.NFAParseTable.super_ParseTable.ProductionErrorTerminals._M_h._M_single_bucket =
       (__node_base_ptr)0xffffffff00000000;
  sgLex.NFAParseTable.super_ParseTable.ReduceProductions.
  super__Vector_base<SGParser::ParseTable::ReduceProduction,_std::allocator<SGParser::ParseTable::ReduceProduction>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sgLex.NFAParseTable.super_ParseTable.StaticFlag = false;
  sgLex.NFAParseTable.super_ParseTable._201_7_ = 0;
  sgLex.NFAParseTable.super_ParseTable.ReduceProductions.
  super__Vector_base<SGParser::ParseTable::ReduceProduction,_std::allocator<SGParser::ParseTable::ReduceProduction>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sgLex.NFAParseTable.super_ParseTable.GotoTable.
  super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sgLex.NFAParseTable.super_ParseTable.GotoTable.
  super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sgLex.NFAParseTable.super_ParseTable.ActionTable.
  super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sgLex.NFAParseTable.super_ParseTable.GotoWidth = 0;
  sgLex.NFAParseTable.super_ParseTable.ActionTable.
  super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sgLex.NFAParseTable.super_ParseTable.ActionTable.
  super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sgLex.NFAParseTable.super_ParseTable.Type = None;
  sgLex.NFAParseTable.super_ParseTable.InitialState = 0;
  sgLex.NFAParseTable.super_ParseTable.ActionWidth = 0;
  sgLex.NFAParseTable.super_ParseTable.GotoTable.
  super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  sgLex.NFAParseTable.super_ParseTable.ReduceProductions.
  super__Vector_base<SGParser::ParseTable::ReduceProduction,_std::allocator<SGParser::ParseTable::ReduceProduction>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0xff;
  sgLex.Messages.Flags = 0;
  sgLex.Messages._4_4_ = 0;
  sgTokenizer.super_TokenizerImpl<SGParser::Generator::StdGrammarToken>.HeadPos.Offset = 0;
  sgTokenizer.super_TokenizerImpl<SGParser::Generator::StdGrammarToken>.TailPos.Line = 0;
  sgTokenizer.super_TokenizerImpl<SGParser::Generator::StdGrammarToken>.super_TokenizerBase.
  pInputStream = (InputStream *)0x0;
  sgTokenizer.super_TokenizerImpl<SGParser::Generator::StdGrammarToken>.HeadPos.Line = 0;
  sgTokenizer.super_TokenizerImpl<SGParser::Generator::StdGrammarToken>.super_TokenizerBase.
  pTailBuffer = (TokenizerBuffer *)0x0;
  sgTokenizer.super_TokenizerImpl<SGParser::Generator::StdGrammarToken>.super_TokenizerBase.
  pFreeBuffer = (TokenizerBuffer *)0x0;
  sgTokenizer.super_TokenizerImpl<SGParser::Generator::StdGrammarToken>.super_TokenizerBase.
  pHeadBuffer = (TokenizerBuffer *)0x0;
  sgTokenizer.super_TokenizerImpl<SGParser::Generator::StdGrammarToken>.super_TokenizerBase.pTail =
       (char *)0x0;
  sgTokenizer.super_TokenizerImpl<SGParser::Generator::StdGrammarToken>.
  super_TokenStream<SGParser::Generator::StdGrammarToken>._vptr_TokenStream = (_func_int **)0x0;
  sgTokenizer.super_TokenizerImpl<SGParser::Generator::StdGrammarToken>.super_TokenizerBase.pHead =
       (char *)0x0;
  productions.
  super__Vector_base<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&PTR__DFATokenizer_00163700;
  sgTokenizer.super_TokenizerImpl<SGParser::Generator::StdGrammarToken>._88_8_ = 0;
  sgTokenizer.pDFA._0_4_ = 0xffff;
  sgTokenizer.ExpressionStackTop = 0;
  sgTokenizer._108_4_ = 0;
  sgTokenizer.ExpressionStack.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sgTokenizer.ExpressionStack.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_01 = (StdGrammarParseData *)&sgLex.Messages.pMessages;
  sgLex.Macros._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       sgLex.Macros._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  sgLex.ExpressionNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       sgLex.ExpressionNames._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  sgLex.LexemeNameToToken._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       sgLex.LexemeNameToToken._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  sgLex.LexemeAliasToToken._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       sgLex.LexemeAliasToToken._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  sgLex.Precedence._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       sgLex.Precedence._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  Parse<SGParser::Generator::StdGrammarStackElement>::Parse
            ((Parse<SGParser::Generator::StdGrammarStackElement> *)this_01,(ParseTable *)0x0,0x800);
  sgGrammar.GrammarSymbols._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&sgGrammar;
  sgGrammar.GrammarSymbols._M_t._M_impl._0_4_ = 0;
  sgGrammar.GrammarSymbols._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sgGrammar.GrammarSymbols._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  sgGrammar.GrammarSymbols._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  sgGrammar.GrammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&sgGrammar.GrammarSymbolsInv;
  sgGrammar.GrammarSymbolsInv._M_t._M_impl._0_4_ = 0;
  sgGrammar.GrammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sgGrammar.GrammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  sgGrammar.Productions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&sgGrammar.Productions;
  sgGrammar.Productions._M_t._M_impl._0_4_ = 0;
  sgGrammar.Productions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sgGrammar.Productions._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  sgGrammar.GrammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0
  ;
  sgGrammar.GrammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sgGrammar.GrammarSymbolList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sgGrammar.GrammarSymbolList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sgGrammar.Precedence._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&sgGrammar.Precedence;
  sgGrammar.Precedence._M_t._M_impl._0_4_ = 0;
  sgGrammar.Precedence._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sgGrammar.Precedence._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  sgGrammar.Productions._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  sgGrammar.Productions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sgGrammar.DebugData.CanonicalItems.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sgGrammar.DebugData.Flags = 0;
  sgGrammar.DebugData._4_4_ = 0;
  sgGrammar.DebugData.CanonicalItems.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sgGrammar.DebugData.CanonicalItems.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&sgGrammar.DebugData.Conflicts._M_string_length;
  sgGrammar.Precedence._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  sgGrammar.Precedence._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sgGrammar.StartSymbols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sgGrammar.StartSymbols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sgGrammar.StartSymbols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  sgGrammar.DebugData.Conflicts._M_dataplus._M_p = (pointer)0x0;
  sgGrammar.DebugData.Conflicts._M_string_length._0_1_ = 0;
  sgGrammar.DebugData.Conflicts.field_2._8_8_ = 0;
  sgGrammar.DebugData.Progress.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sgGrammar.DebugData.Progress.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sgGrammar.DebugData.Progress.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0xff;
  sgGrammar.Messages.Flags = 0;
  sgGrammar.Messages._4_4_ = 0;
  sgParseHandler.ExpressionBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&sgParseHandler.ExpressionBlocks;
  sgGrammar.Messages.pMessages = (Messages *)&PTR__StdGrammarParseHandler_001636a0;
  sgParseHandler.super_ParseHandler<SGParser::Generator::StdGrammarStackElement>._vptr_ParseHandler.
  _0_4_ = 0xff;
  sgParseHandler.ExpressionBlocks._M_t._M_impl._0_4_ = 0;
  sgParseHandler.ExpressionBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sgParseHandler.ExpressionBlocks._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  sgParseHandler.Messages.Flags = 0;
  sgParseHandler.Messages._4_4_ = 0;
  sgParseHandler.Messages.pMessages = (Messages *)0x0;
  sgParseHandler.ErrorCount = 0;
  sgParseHandler.MacroBlock = 0;
  sgParseHandler.ProductionStartSymbols._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&sgParseHandler.ProductionStartSymbols;
  sgParseHandler.ProductionStartSymbols._M_t._M_impl._0_4_ = 0;
  sgParseHandler.ProductionStartSymbols._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  sgParseHandler.ProductionStartSymbols._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  sgParseHandler.ExpressionBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  sgParseHandler.ExpressionBlocks._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sgParseHandler.OrderedStartSymbols.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sgParseHandler.OrderedStartSymbols.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sgParseHandler.ProductionStartSymbols._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  sgParseHandler.MacroLines._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&sgParseHandler.MacroLines;
  sgParseHandler.MacroLines._M_t._M_impl._0_4_ = 0;
  sgParseHandler.MacroLines._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sgParseHandler.MacroLines._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  sgParseHandler.MacroLines._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  sgParseHandler.ExpressionAliasLines._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&sgParseHandler.ExpressionAliasLines;
  sgParseHandler.ExpressionAliasLines._M_t._M_impl._0_4_ = 0;
  sgParseHandler.ExpressionAliasLines._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
  ;
  sgParseHandler.ExpressionAliasLines._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  sgParseHandler.ExpressionAliasLines._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  sgParseHandler.ProductionLines._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&sgParseHandler.ProductionLines;
  sgParseHandler.ProductionLines._M_t._M_impl._0_4_ = 0;
  sgParseHandler.ProductionLines._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sgParseHandler.ProductionLines._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  sgParseHandler.ProductionLines._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  sgParseHandler.PrecedenceLines._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&sgParseHandler.PrecedenceLines;
  sgParseHandler.PrecedenceLines._M_t._M_impl._0_4_ = 0;
  sgParseHandler.PrecedenceLines._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sgParseHandler.PrecedenceLines._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  sgParseHandler.PrecedenceLines._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  sgParseHandler.PrecedenceLines._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
  sgParseHandler.Productions.
  super__Vector_base<SGParser::Generator::StdGrammarParseHandler::ProductionData,_std::allocator<SGParser::Generator::StdGrammarParseHandler::ProductionData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sgParseHandler.Productions.
  super__Vector_base<SGParser::Generator::StdGrammarParseHandler::ProductionData,_std::allocator<SGParser::Generator::StdGrammarParseHandler::ProductionData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sgParseHandler.PrecValue = 0;
  sgParseHandler._364_4_ = 0;
  sgParseHandler.Productions.
  super__Vector_base<SGParser::Generator::StdGrammarParseHandler::ProductionData,_std::allocator<SGParser::Generator::StdGrammarParseHandler::ProductionData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sgTokenizer.ExpressionStack.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  grammarSymbolVC._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&grammarSymbolVC;
  grammarSymbolVC._M_t._M_impl._0_4_ = 0;
  grammarSymbolVC._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  grammarSymbolVC._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  grammarSymbolVC._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  sgGrammar.GrammarSymbols._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       sgGrammar.GrammarSymbols._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  sgGrammar.GrammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       sgGrammar.GrammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  sgGrammar.Productions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       sgGrammar.Productions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  sgGrammar.Precedence._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       sgGrammar.Precedence._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  sgParseHandler.ExpressionBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       sgParseHandler.ExpressionBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  sgParseHandler.ProductionStartSymbols._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       sgParseHandler.ProductionStartSymbols._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  sgParseHandler.MacroLines._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       sgParseHandler.MacroLines._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  sgParseHandler.ExpressionAliasLines._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       sgParseHandler.ExpressionAliasLines._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  sgParseHandler.ProductionLines._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       sgParseHandler.ProductionLines._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  sgParseHandler.PrecedenceLines._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       sgParseHandler.PrecedenceLines._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  grammarSymbolVC._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       grammarSymbolVC._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if ((this->StdGrammarDFA).super_DFA.TransitionTable.
      super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->StdGrammarDFA).super_DFA.TransitionTable.
      super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    CreateLexemes(this_01,(vector<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_> *)
                          &sgLex.MacroNames.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    this_01 = (StdGrammarParseData *)local_7c8;
    bVar1 = Lex::MakeDFA((Lex *)this_01,&this->StdGrammarDFA,NFA);
    if (bVar1) goto LAB_001304c9;
  }
  else {
LAB_001304c9:
    if ((this->StdGrammarParseTable).super_ParseTable.Type == None) {
      CreateVectors(this_01,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                             *)&sgParseHandler.pLex,
                    (vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
                     *)&sgTokenizer.ExpressionStack.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
      Grammar::Create((Grammar *)((long)&sgParser.ErrorStackStr.field_2 + 8),
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       *)&sgParseHandler.pLex,
                      (vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
                       *)&sgTokenizer.ExpressionStack.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      ParseMessageBuffer::SetMessageBuffer
                ((ParseMessageBuffer *)
                 &sgGrammar.DebugData.Progress.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(this->Messages).pMessages,
                 (this->Messages).Flags);
      sgGrammar.StartSymbols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage._0_4_ =
           (uint)sgGrammar.StartSymbols.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage | 1;
      bVar1 = ParseTableGen::Create
                        (&this->StdGrammarParseTable,
                         (Grammar *)((long)&sgParser.ErrorStackStr.field_2 + 8),CLR);
      if (!bVar1) goto LAB_001306f5;
    }
    bVar1 = Parse<SGParser::Generator::StdGrammarStackElement>::Create
                      ((Parse<SGParser::Generator::StdGrammarStackElement> *)
                       &sgLex.Messages.pMessages,&(this->StdGrammarParseTable).super_ParseTable,
                       0x800);
    if (bVar1) {
      sgTokenizer.super_TokenizerImpl<SGParser::Generator::StdGrammarToken>.HeadPos.Offset = 0;
      sgTokenizer.super_TokenizerImpl<SGParser::Generator::StdGrammarToken>.TailPos.Line = 0;
      sgTokenizer.super_TokenizerImpl<SGParser::Generator::StdGrammarToken>.super_TokenizerBase.
      pInputStream = (InputStream *)0x0;
      sgTokenizer.super_TokenizerImpl<SGParser::Generator::StdGrammarToken>.HeadPos.Line = 0;
      bVar1 = TokenizerBase::SetInputStream((TokenizerBase *)&sgTokenizer,pinitStr);
      if (bVar1) {
        sgTokenizer.pDFA._0_4_ = 0;
        if (sgTokenizer.ExpressionStack.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)sgTokenizer._104_8_) {
          sgTokenizer.ExpressionStack.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)sgTokenizer._104_8_;
        }
        sgParser.pParseTable =
             (ParseTable *)
             &productions.
              super__Vector_base<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
        sgTokenizer.super_TokenizerImpl<SGParser::Generator::StdGrammarToken>._88_8_ =
             &this->StdGrammarDFA;
        Parse<SGParser::Generator::StdGrammarStackElement>::ResetParse
                  ((Parse<SGParser::Generator::StdGrammarStackElement> *)&sgLex.Messages.pMessages);
        sgParseHandler.Productions.
        super__Vector_base<SGParser::Generator::StdGrammarParseHandler::ProductionData,_std::allocator<SGParser::Generator::StdGrammarParseHandler::ProductionData>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&this->UserLex;
        ParseMessageBuffer::SetMessageBuffer
                  ((ParseMessageBuffer *)&sgParseHandler,(this->Messages).pMessages,
                   (this->Messages).Flags);
        bVar1 = Parse<SGParser::Generator::StdGrammarStackElement>::DoParse
                          ((Parse<SGParser::Generator::StdGrammarStackElement> *)
                           &sgLex.Messages.pMessages,
                           (ParseHandler<SGParser::Generator::StdGrammarStackElement> *)
                           &sgGrammar.Messages.pMessages);
        if (bVar1 && sgParseHandler.Messages.pMessages == (Messages *)0x0) {
          Lex::ConvertActionParam(&this->UserLex);
          grammarSymbols._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)&grammarSymbols;
          grammarSymbols._M_t._M_impl._0_4_ = 0;
          grammarSymbols._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          grammarSymbols._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          grammarSymbols._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
          productions.
          super__Vector_base<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          grammarSymbols._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          productions.
          super__Vector_base<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          startSymbols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          auStack_48 = (undefined1  [8])0x0;
          startSymbols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          grammarSymbols._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               grammarSymbols._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          bVar1 = CreateSymbolMap(this,(StdGrammarParseHandler *)&sgGrammar.Messages.pMessages,
                                  (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                   *)&grammarSymbolVC._M_t._M_impl.super__Rb_tree_header.
                                      _M_node_count,
                                  (vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
                                   *)&grammarSymbols._M_t._M_impl.super__Rb_tree_header.
                                      _M_node_count,
                                  (vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_48)
          ;
          if (bVar1) {
            this_00 = &this->UserGrammar;
            Grammar::Clear(this_00);
            ParseMessageBuffer::SetMessageBuffer
                      (&(this->UserGrammar).Messages,(this->Messages).pMessages,
                       (this->Messages).Flags);
            Grammar::SetPrecedence(this_00,&(this->UserLex).Precedence);
            Grammar::SetStartSymbols
                      (this_00,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_48);
            Grammar::AddGrammarSymbols
                      (this_00,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                *)&grammarSymbolVC._M_t._M_impl.super__Rb_tree_header._M_node_count)
            ;
            Grammar::AddProductions
                      (this_00,(vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
                                *)&grammarSymbols._M_t._M_impl.super__Rb_tree_header._M_node_count);
          }
          if (auStack_48 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_48,
                            (long)startSymbols.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)auStack_48);
          }
          std::
          vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
          ::~vector((vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
                     *)&grammarSymbols._M_t._M_impl.super__Rb_tree_header._M_node_count);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       *)&grammarSymbolVC._M_t._M_impl.super__Rb_tree_header._M_node_count);
          goto LAB_001306f8;
        }
      }
    }
  }
LAB_001306f5:
  bVar1 = false;
LAB_001306f8:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               *)&sgParseHandler.pLex);
  std::vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>::
  ~vector((vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
           *)&sgTokenizer.ExpressionStack.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::
  vector<SGParser::Generator::StdGrammarParseHandler::ProductionData,_std::allocator<SGParser::Generator::StdGrammarParseHandler::ProductionData>_>
  ::~vector((vector<SGParser::Generator::StdGrammarParseHandler::ProductionData,_std::allocator<SGParser::Generator::StdGrammarParseHandler::ProductionData>_>
             *)&sgParseHandler.PrecValue);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
               *)&sgParseHandler.ProductionLines._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               *)&sgParseHandler.ExpressionAliasLines._M_t._M_impl.super__Rb_tree_header.
                  _M_node_count);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               *)&sgParseHandler.MacroLines._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               *)&sgParseHandler.ProductionStartSymbols._M_t._M_impl.super__Rb_tree_header.
                  _M_node_count);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               *)&sgParseHandler.OrderedStartSymbols.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&sgParseHandler.ExpressionBlocks._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               *)&sgParseHandler.PrecedenceBlock);
  Grammar::~Grammar((Grammar *)((long)&sgParser.ErrorStackStr.field_2 + 8));
  Parse<SGParser::Generator::StdGrammarStackElement>::~Parse
            ((Parse<SGParser::Generator::StdGrammarStackElement> *)&sgLex.Messages.pMessages);
  productions.
  super__Vector_base<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&PTR__DFATokenizer_00163700;
  if (sgTokenizer._104_8_ != 0) {
    operator_delete((void *)sgTokenizer._104_8_,
                    (long)sgTokenizer.ExpressionStack.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish - sgTokenizer._104_8_);
  }
  TokenizerBase::FreeAllBuffers((TokenizerBase *)&sgTokenizer);
  Lex::~Lex((Lex *)local_7c8);
  return bVar1;
}

Assistant:

bool StdGrammarParseData::BuildParser(InputStream* pinitStr) {
    // *** Internal Standard Grammar parser data

    Lex                           sgLex;
    DFATokenizer<StdGrammarToken> sgTokenizer;
    Parse<StdGrammarStackElement> sgParser;
    Grammar                       sgGrammar;
    StdGrammarParseHandler        sgParseHandler;

    std::vector<Production>       productionVC;
    std::map<String, unsigned>    grammarSymbolVC;

    // *** Load grammar

    if (!StdGrammarDFA.IsValid()) {
        // Setup the lexemes list with the hard-coded values
        CreateLexemes(sgLex.Lexemes);

        // Create a VPP DFA
        if (!sgLex.MakeDFA(StdGrammarDFA))
            return false;
    }

    if (!StdGrammarParseTable.IsValid()) {
        // Load the hard coded grammar... for the SG parser Standard Grammar file format
        CreateVectors(grammarSymbolVC, productionVC);

        // Create the grammar
        sgGrammar.Create(grammarSymbolVC, productionVC);

        // Create a parse table
        sgGrammar.GetMessageBuffer().SetMessageBuffer(Messages.GetMessageBuffer(),
                                                      Messages.GetMessageFlags());
        sgGrammar.GetDebugData().Flags |= GrammarDebugData::Canonical;

        if (!StdGrammarParseTable.Create(sgGrammar, ParseTableType::CLR))
            return false;
    }

    // *** Parse grammar

    // Create the parse class
    if (!sgParser.Create(&StdGrammarParseTable))
        return false;

    // Setup the tokenizer
    if (!sgTokenizer.Create(&StdGrammarDFA, pinitStr))
        return false;

    // Setup the parse class
    sgParser.SetTokenStream(&sgTokenizer);

    // Setup the parse handler
    sgParseHandler.pLex = &UserLex;
    sgParseHandler.Messages.SetMessageBuffer(Messages.GetMessageBuffer(),
                                             Messages.GetMessageFlags());

    // Parse the grammar
    const auto result = sgParser.DoParse(sgParseHandler);

    // Errors were encountered while parsing the command line input
    if (!result || sgParseHandler.ErrorCount > 0u)
        return false;

    // Converts action parameters into numbers
    UserLex.ConvertActionParam();

    std::map<String, unsigned> grammarSymbols;
    std::vector<Production>    productions;
    std::vector<unsigned>      startSymbols;

    // Create the grammar symbol map and production array from the productions data
    if (!CreateSymbolMap(sgParseHandler, grammarSymbols, productions, startSymbols))
        return false;

    UserGrammar.Clear();

    // Setup grammar debug and buffer
    UserGrammar.GetMessageBuffer().SetMessageBuffer(Messages.GetMessageBuffer(),
                                                    Messages.GetMessageFlags());

    // Now 'grammarSymbols' and 'productions' contain the
    // information needed to make the parser and tokenizer
    UserGrammar.SetPrecedence(UserLex.Precedence);
    UserGrammar.SetStartSymbols(startSymbols);

    UserGrammar.AddGrammarSymbols(grammarSymbols);
    UserGrammar.AddProductions(productions);

    return true;
}